

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char cVar1;
  char *pcVar2;
  Ch *pCVar3;
  Ch *pCVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  int iVar8;
  ulong uVar9;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar10;
  byte bVar11;
  uint16_t uVar12;
  ulong uVar13;
  byte bVar14;
  long lVar15;
  int iVar16;
  byte *pbVar17;
  byte *pbVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  
  pcVar2 = is->src_;
  pCVar3 = is->dst_;
  pCVar4 = is->head_;
  cVar1 = *pcVar2;
  pbVar18 = (byte *)(pcVar2 + (cVar1 == '-'));
  bVar11 = pcVar2[cVar1 == '-'];
  if (bVar11 == 0x30) {
    pbVar17 = pbVar18 + 1;
    bVar7 = false;
    iVar8 = 0;
    uVar19 = 0;
    uVar20 = 0;
    goto LAB_0011aa94;
  }
  if ((byte)(bVar11 - 0x31) < 9) {
    uVar20 = bVar11 - 0x30;
    bVar11 = pbVar18[1];
    pbVar17 = pbVar18 + 1;
    if (cVar1 == '-') {
      if ((byte)(bVar11 - 0x30) < 10) {
        iVar8 = 0;
        do {
          if ((0xccccccb < uVar20) && ('8' < (char)bVar11 || uVar20 != 0xccccccc))
          goto LAB_0011aa8a;
          uVar20 = ((uint)bVar11 + uVar20 * 10) - 0x30;
          iVar8 = iVar8 + 1;
          bVar11 = pbVar17[1];
          pbVar17 = pbVar17 + 1;
        } while ((byte)(bVar11 - 0x30) < 10);
      }
      else {
LAB_0011b1be:
        iVar8 = 0;
      }
    }
    else {
      if (9 < (byte)(bVar11 - 0x30)) goto LAB_0011b1be;
      iVar8 = 0;
      do {
        if ((0x19999998 < uVar20) && ('5' < (char)bVar11 || uVar20 != 0x19999999))
        goto LAB_0011aa8a;
        uVar20 = ((uint)bVar11 + uVar20 * 10) - 0x30;
        iVar8 = iVar8 + 1;
        bVar11 = pbVar17[1];
        pbVar17 = pbVar17 + 1;
      } while ((byte)(bVar11 - 0x30) < 10);
    }
    bVar7 = false;
    uVar19 = 0;
    goto LAB_0011aa94;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                  ,0x5fc,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  lVar15 = (long)pbVar18 - (long)pCVar4;
  *(undefined4 *)(this + 0x30) = 3;
  goto LAB_0011b1d0;
LAB_0011aa8a:
  bVar7 = true;
  uVar19 = uVar20;
LAB_0011aa94:
  uVar9 = (ulong)uVar19;
  dVar25 = 0.0;
  if (bVar7) {
    bVar11 = *pbVar17;
    bVar14 = bVar11 - 0x30;
    if (cVar1 == '-') {
      while (bVar14 < 10) {
        if ((0xccccccccccccccb < uVar9) && (uVar9 != 0xccccccccccccccc || '8' < (char)bVar11))
        goto LAB_0011abbe;
        uVar9 = (ulong)(bVar11 & 0xf) + uVar9 * 10;
        iVar8 = iVar8 + 1;
        bVar11 = pbVar17[1];
        pbVar17 = pbVar17 + 1;
        bVar14 = bVar11 - 0x30;
      }
    }
    else {
      while (bVar14 < 10) {
        if ((0x1999999999999998 < uVar9) && (uVar9 != 0x1999999999999999 || '5' < (char)bVar11))
        goto LAB_0011abbe;
        uVar9 = (ulong)(bVar11 & 0xf) + uVar9 * 10;
        iVar8 = iVar8 + 1;
        bVar11 = pbVar17[1];
        pbVar17 = pbVar17 + 1;
        bVar14 = bVar11 - 0x30;
      }
    }
  }
  bVar5 = false;
  goto LAB_0011abe6;
LAB_0011abbe:
  auVar22._8_4_ = (int)(uVar9 >> 0x20);
  auVar22._0_8_ = uVar9;
  auVar22._12_4_ = 0x45300000;
  dVar25 = (auVar22._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
  bVar5 = true;
LAB_0011abe6:
  if (bVar5) {
    bVar11 = *pbVar17;
    while ((byte)(bVar11 - 0x30) < 10) {
      dVar25 = dVar25 * 10.0 + (double)(int)(bVar11 - 0x30);
      pbVar18 = pbVar17 + 1;
      pbVar17 = pbVar17 + 1;
      bVar11 = *pbVar18;
    }
  }
  pbVar18 = pbVar17 + (*pbVar17 == 0x2e);
  iVar16 = 0;
  uVar13 = uVar9;
  if (*pbVar17 == 0x2e) {
    if (0xf5 < (byte)(*pbVar18 - 0x3a)) {
      iVar16 = 0;
      if (!bVar5) {
        uVar13 = (ulong)uVar20;
        if (bVar7) {
          uVar13 = uVar9;
        }
        bVar11 = *pbVar18;
        iVar16 = 0;
        if ((0xf5 < (byte)(bVar11 - 0x3a)) && (iVar16 = 0, uVar13 < 0x20000000000000)) {
          lVar15 = 0;
          do {
            uVar13 = ((ulong)bVar11 & 0xf) + uVar13 * 10;
            iVar8 = (uint)(uVar13 != 0) + iVar8;
            bVar11 = pbVar18[lVar15 + 1];
            lVar15 = lVar15 + 1;
            if ((byte)(bVar11 - 0x3a) < 0xf6) break;
          } while (uVar13 < 0x20000000000000);
          iVar16 = -(int)lVar15;
          pbVar18 = pbVar18 + lVar15;
        }
        auVar23._8_4_ = (int)(uVar13 >> 0x20);
        auVar23._0_8_ = uVar13;
        auVar23._12_4_ = 0x45300000;
        dVar25 = (auVar23._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
        bVar5 = true;
      }
      bVar11 = *pbVar18;
      while ((byte)(bVar11 - 0x30) < 10) {
        if (iVar8 < 0x11) {
          dVar25 = dVar25 * 10.0 + (double)(int)(bVar11 - 0x30);
          iVar16 = iVar16 + -1;
          if (0.0 < dVar25) {
            iVar8 = iVar8 + 1;
          }
        }
        pbVar17 = pbVar18 + 1;
        pbVar18 = pbVar18 + 1;
        bVar11 = *pbVar17;
      }
      goto LAB_0011ad3f;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                    ,0x627,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar15 = (long)pbVar18 - (long)pCVar4;
    *(undefined4 *)(this + 0x30) = 0xe;
  }
  else {
LAB_0011ad3f:
    lVar15 = (long)pcVar2 - (long)pCVar4;
    bVar11 = *pbVar18;
    pbVar18 = pbVar18 + (bVar11 == 0x65);
    if (bVar11 == 0x65) {
LAB_0011ad7d:
      uVar9 = (ulong)uVar20;
      if (bVar7) {
        uVar9 = uVar13;
      }
      if (!bVar5) {
        auVar24._8_4_ = (int)(uVar9 >> 0x20);
        auVar24._0_8_ = uVar9;
        auVar24._12_4_ = 0x45300000;
        dVar25 = (auVar24._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
        bVar5 = true;
      }
      bVar11 = *pbVar18;
      pbVar18 = pbVar18 + (bVar11 == 0x2b);
      bVar21 = false;
      if (bVar11 != 0x2b) {
        bVar21 = *pbVar18 == 0x2d;
        pbVar18 = pbVar18 + bVar21;
      }
      bVar11 = *pbVar18;
      if ((byte)(bVar11 - 0x30) < 10) {
        pbVar18 = pbVar18 + 1;
        iVar8 = bVar11 - 0x30;
        if (bVar21) {
          if (0 < iVar16) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                          ,0x667,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          bVar11 = *pbVar18;
          if ((byte)(bVar11 - 0x30) < 10) {
            do {
              iVar8 = (uint)bVar11 + iVar8 * 10 + -0x30;
              if ((iVar16 + 0x7ffffff7) / 10 < iVar8) {
                do {
                  pbVar17 = pbVar18 + 1;
                  pbVar18 = pbVar18 + 1;
                } while ((byte)(*pbVar17 - 0x30) < 10);
              }
              else {
                pbVar18 = pbVar18 + 1;
              }
              bVar11 = *pbVar18;
            } while ((byte)(bVar11 - 0x30) < 10);
          }
        }
        else {
          do {
            bVar11 = *pbVar18;
            bVar14 = bVar11 - 0x30;
            if (9 < bVar14) goto LAB_0011aec7;
            pbVar18 = pbVar18 + 1;
            iVar8 = (uint)bVar11 + iVar8 * 10 + -0x30;
          } while (iVar8 <= 0x134 - iVar16);
          ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    ();
LAB_0011aec7:
          if (bVar14 < 10) {
            bVar21 = false;
            goto LAB_0011aeeb;
          }
        }
        iVar6 = -iVar8;
        if (!bVar21) {
          iVar6 = iVar8;
        }
        iVar8 = iVar6;
        bVar21 = true;
      }
      else {
        ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                  ();
        bVar21 = false;
        iVar8 = 0;
      }
LAB_0011aeeb:
      if (!bVar21) goto LAB_0011b116;
    }
    else {
      bVar11 = *pbVar18;
      pbVar18 = pbVar18 + (bVar11 == 0x45);
      iVar8 = 0;
      if (bVar11 == 0x45) goto LAB_0011ad7d;
    }
    if (bVar5) {
      uVar19 = iVar8 + iVar16;
      if ((int)uVar19 < -0x134) {
        dVar26 = 0.0;
        if (-0x269 < (int)uVar19) {
          uVar19 = -uVar19 - 0x134;
          if (0x134 < uVar19) goto LAB_0011b1f8;
          dVar25 = dVar25 / 1e+308;
LAB_0011b087:
          dVar26 = dVar25 / *(double *)(internal::Pow10(int)::e + (ulong)uVar19 * 8);
        }
      }
      else {
        if ((int)uVar19 < 0) {
          uVar19 = -uVar19;
          if (0x134 < uVar19) goto LAB_0011b1f8;
          goto LAB_0011b087;
        }
        if (0x134 < uVar19) {
LAB_0011b1f8:
          __assert_fail("n >= 0 && n <= 308",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/internal/pow10.h"
                        ,0x30,"double rapidjson::internal::Pow10(int)");
        }
        dVar26 = dVar25 * *(double *)(internal::Pow10(int)::e + (ulong)uVar19 * 8);
      }
      if (dVar26 <= 1.79769313486232e+308) {
        pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        if (cVar1 == '-') {
          dVar26 = -dVar26;
        }
        (pGVar10->data_).n = (Number)0x0;
        (pGVar10->data_).s.str = (Ch *)0x0;
        *(double *)&pGVar10->data_ = dVar26;
        (pGVar10->data_).f.flags = 0x216;
        bVar7 = true;
        bVar5 = false;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_c_cmakelists/ntrrgc[P]right-window/vendor/rapidjson/reader.h"
                        ,0x6ab,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        *(long *)(this + 0x38) = lVar15;
        bVar5 = true;
        bVar7 = true;
      }
    }
    else {
      if (bVar7) {
        if (cVar1 != '-') {
          pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar10->data_).n = (Number)0x0;
          (pGVar10->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar10->data_ = uVar13;
          uVar12 = (ushort)((uVar13 & 0xffffffff80000000) == 0) * 0x20 +
                   ((ushort)(uVar13 >> 0x20 == 0) << 6 | (ushort)(-1 < (long)uVar13) << 7) + 0x116;
LAB_0011b062:
          (pGVar10->data_).f.flags = uVar12;
          goto LAB_0011b066;
        }
        bVar7 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::Int64(handler,-uVar13);
      }
      else {
        if (cVar1 != '-') {
          pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
                    Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                              (&handler->stack_,1);
          (pGVar10->data_).n = (Number)0x0;
          (pGVar10->data_).s.str = (Ch *)0x0;
          *(ulong *)&pGVar10->data_ = (ulong)uVar20;
          uVar12 = (ushort)(-1 < (int)uVar20) << 5 | 0x1d6;
          goto LAB_0011b062;
        }
        pGVar10 = internal::Stack<rapidjson::CrtAllocator>::
                  Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                            (&handler->stack_,1);
        uVar12 = 0xb6;
        if ((int)uVar20 < 1) {
          uVar12 = 0x1f6;
        }
        (pGVar10->data_).n = (Number)0x0;
        (pGVar10->data_).s.str = (Ch *)0x0;
        *(long *)&pGVar10->data_ = (long)(int)-uVar20;
        (pGVar10->data_).f.flags = uVar12;
LAB_0011b066:
        bVar7 = true;
      }
      bVar5 = false;
    }
    if ((bVar5) || (bVar7 != false)) goto LAB_0011b116;
    ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this);
  }
LAB_0011b1d0:
  *(long *)(this + 0x38) = lVar15;
LAB_0011b116:
  is->src_ = (Ch *)pbVar18;
  is->dst_ = pCVar3;
  is->head_ = pCVar4;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }
            
            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    // (exp + expFrac) must not underflow int => we're detecting when -exp gets
                    // dangerously close to INT_MIN (a pessimistic next digit 9 would push it into
                    // underflow territory):
                    //
                    //        -(exp * 10 + 9) + expFrac >= INT_MIN
                    //   <=>  exp <= (expFrac - INT_MIN - 9) / 10
                    RAPIDJSON_ASSERT(expFrac <= 0);
                    int maxExp = (expFrac + 2147483639) / 10;

                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp)) {
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               // Use > max, instead of == inf, to fix bogus warning -Wfloat-equal
               if (d > std::numeric_limits<double>::max()) {
                   // Overflow
                   // TODO: internal::StrtodX should report overflow (or underflow)
                   RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
               }

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }